

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CurlHandle.cpp
# Opt level: O0

void __thiscall curlpp::internal::CurlHandle::CurlHandle(CurlHandle *this)

{
  char *buffer;
  undefined8 *in_RDI;
  CurlHandle *this_00;
  undefined1 isOkay;
  char *reason;
  
  *in_RDI = &PTR__CurlHandle_00162c48;
  utilspp::
  Functor<unsigned_long,_utilspp::tl::TypeList<char_*,_utilspp::tl::TypeList<unsigned_long,_utilspp::tl::TypeList<unsigned_long,_utilspp::NullType>_>_>_>
  ::Functor((Functor<unsigned_long,_utilspp::tl::TypeList<char_*,_utilspp::tl::TypeList<unsigned_long,_utilspp::tl::TypeList<unsigned_long,_utilspp::NullType>_>_>_>
             *)0x14d6be);
  utilspp::
  Functor<unsigned_long,_utilspp::tl::TypeList<char_*,_utilspp::tl::TypeList<unsigned_long,_utilspp::tl::TypeList<unsigned_long,_utilspp::NullType>_>_>_>
  ::Functor((Functor<unsigned_long,_utilspp::tl::TypeList<char_*,_utilspp::tl::TypeList<unsigned_long,_utilspp::tl::TypeList<unsigned_long,_utilspp::NullType>_>_>_>
             *)0x14d6d4);
  utilspp::
  Functor<unsigned_long,_utilspp::tl::TypeList<char_*,_utilspp::tl::TypeList<unsigned_long,_utilspp::tl::TypeList<unsigned_long,_utilspp::NullType>_>_>_>
  ::Functor((Functor<unsigned_long,_utilspp::tl::TypeList<char_*,_utilspp::tl::TypeList<unsigned_long,_utilspp::tl::TypeList<unsigned_long,_utilspp::NullType>_>_>_>
             *)0x14d6ec);
  reason = (char *)(in_RDI + 0x26);
  utilspp::
  Functor<int,_utilspp::tl::TypeList<double,_utilspp::tl::TypeList<double,_utilspp::tl::TypeList<double,_utilspp::tl::TypeList<double,_utilspp::NullType>_>_>_>_>
  ::Functor((Functor<int,_utilspp::tl::TypeList<double,_utilspp::tl::TypeList<double,_utilspp::tl::TypeList<double,_utilspp::tl::TypeList<double,_utilspp::NullType>_>_>_>_>
             *)0x14d704);
  isOkay = (undefined1)((ulong)(in_RDI + 0x27) >> 0x38);
  utilspp::
  Functor<int,_utilspp::tl::TypeList<curl_infotype,_utilspp::tl::TypeList<char_*,_utilspp::tl::TypeList<unsigned_long,_utilspp::NullType>_>_>_>
  ::Functor((Functor<int,_utilspp::tl::TypeList<curl_infotype,_utilspp::tl::TypeList<char_*,_utilspp::tl::TypeList<unsigned_long,_utilspp::NullType>_>_>_>
             *)0x14d71c);
  this_00 = (CurlHandle *)(in_RDI + 0x28);
  utilspp::Functor<CURLcode,_utilspp::tl::TypeList<void_*,_utilspp::NullType>_>::Functor
            ((Functor<CURLcode,_utilspp::tl::TypeList<void_*,_utilspp::NullType>_> *)0x14d734);
  in_RDI[0x29] = 0;
  memset(in_RDI + 2,0,0x101);
  buffer = (char *)curl_easy_init();
  in_RDI[1] = buffer;
  runtimeAssert(reason,(bool)isOkay);
  errorBuffer(this_00,buffer);
  return;
}

Assistant:

CurlHandle::CurlHandle() 
	: mException(NULL)
{
	memset(mErrorBuffer,0,CURL_ERROR_SIZE + 1);
	mCurl = curl_easy_init();
	runtimeAssert("Error when trying to curl_easy_init() a handle", mCurl != NULL);
	errorBuffer(mErrorBuffer);
}